

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_value.hpp
# Opt level: O1

value_ptr __thiscall
pstore::diff_dump::
make_index_diff<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>(*)(pstore::database&,bool)>
          (diff_dump *this,czstring name,database *db,revision_number new_revision,
          revision_number old_revision,
          _func_shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_database_ptr_bool
          *get_index)

{
  char *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar3;
  value_ptr vVar4;
  initializer_list<pstore::dump::object::member> __l;
  revision_restorer _;
  allocator_type local_119;
  undefined1 local_118 [32];
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_f8;
  value_ptr local_e0;
  value_ptr local_d0;
  string local_c0;
  database *local_a0;
  uint local_98;
  member local_90;
  member local_60;
  
  if (old_revision <= new_revision) {
    local_a0 = db;
    local_98 = database::get_current_revision(db);
    database::sync(db);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    local_118._0_8_ = (string *)0x0;
    local_e0.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)name;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pstore::dump::string,std::allocator<pstore::dump::string>,char_const*&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),(string **)local_118,
               (allocator<pstore::dump::string> *)&local_119,(char **)&local_e0);
    local_d0.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_118._0_8_;
    local_d0.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_118._8_8_ + 8) = *(_Atomic_word *)(local_118._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_118._8_8_ + 8) = *(_Atomic_word *)(local_118._8_8_ + 8) + 1;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    dump::object::member::member(&local_90,&local_c0,&local_d0);
    local_118._0_8_ = (string *)(local_118 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"members","");
    make_diff<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>(*)(pstore::database&,bool)>
              ((diff_dump *)&local_e0,db,old_revision,get_index);
    dump::object::member::member(&local_60,(string *)local_118,&local_e0);
    __l._M_len = 2;
    __l._M_array = &local_90;
    std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
              (&local_f8,__l,&local_119);
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00141e08;
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__object_00143078;
    *(pointer *)&p_Var2[1]._M_use_count =
         local_f8.
         super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
         ._M_impl.super__Vector_impl_data._M_start;
    p_Var2[2]._vptr__Sp_counted_base =
         (_func_int **)
         local_f8.
         super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)&p_Var2[2]._M_use_count =
         local_f8.
         super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f8.
    super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined1 *)&p_Var2[3]._vptr__Sp_counted_base = 0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = p_Var2 + 1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = 2;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::
    ~vector(&local_f8);
    lVar3 = 0;
    do {
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&local_60.val.
                        super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + lVar3);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      pcVar1 = *(char **)((long)&local_60.property._M_dataplus._M_p + lVar3);
      if (local_60.property.field_2._M_local_buf + lVar3 != pcVar1) {
        operator_delete(pcVar1,*(long *)((long)&local_60.property.field_2 + lVar3) + 1);
      }
      lVar3 = lVar3 + -0x30;
    } while (lVar3 != -0x60);
    if (local_e0.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((string *)local_118._0_8_ != (string *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if (local_d0.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    no_ex_escape<pstore::diff_dump::details::revision_restorer::~revision_restorer()::_lambda()_1_>
              ((revision_restorer *)&local_a0);
    vVar4.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    vVar4.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (value_ptr)vVar4.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
  }
  assert_failed("new_revision >= old_revision",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/diff_dump/diff_value.hpp"
                ,0x9b);
}

Assistant:

dump::value_ptr make_index_diff (gsl::czstring const name, database & db,
                                         revision_number const new_revision,
                                         revision_number const old_revision,
                                         GetIndexFunction get_index) {
            PSTORE_ASSERT (new_revision >= old_revision);

            details::revision_restorer const _{db};
            db.sync (new_revision);

            return dump::make_value (dump::object::container{
                {"name", dump::make_value (name)},
                {"members", make_diff<Index> (db, old_revision, get_index)},
            });
        }